

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# egluNativeDisplay.cpp
# Opt level: O0

void __thiscall eglu::NativeDisplay::NativeDisplay(NativeDisplay *this,Capability capabilities)

{
  allocator<char> local_15;
  Capability local_14;
  NativeDisplay *pNStack_10;
  Capability capabilities_local;
  NativeDisplay *this_local;
  
  this->_vptr_NativeDisplay = (_func_int **)&PTR__NativeDisplay_0169c878;
  this->m_capabilities = capabilities;
  this->m_platformType = 0x3038;
  local_14 = capabilities;
  pNStack_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&this->m_platformExtension,"",&local_15);
  std::allocator<char>::~allocator(&local_15);
  return;
}

Assistant:

NativeDisplay::NativeDisplay (Capability capabilities)
	: m_capabilities		(capabilities)
	, m_platformType		(EGL_NONE)
	, m_platformExtension	("")
{
	DE_ASSERT(!(capabilities & CAPABILITY_GET_DISPLAY_PLATFORM));
	DE_ASSERT(capabilities & CAPABILITY_GET_DISPLAY_LEGACY);
}